

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  auto_ptr<cmMakefile> aVar1;
  bool bVar2;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pbVar6;
  auto_ptr<cmMakefile> mf;
  string ignoreTargetsRegexes;
  RegularExpression currentRegex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string currentRegexString;
  cmake cm;
  cmGlobalGenerator ggi;
  
  cmake::cmake(&cm,RoleScript);
  std::__cxx11::string::string((string *)&ggi,"",(allocator *)&currentRegex);
  cmake::SetHomeDirectory(&cm,(string *)&ggi);
  std::__cxx11::string::~string((string *)&ggi);
  std::__cxx11::string::string((string *)&ggi,"",(allocator *)&currentRegex);
  cmake::SetHomeOutputDirectory(&cm,(string *)&ggi);
  std::__cxx11::string::~string((string *)&ggi);
  ggi.MakeSilentFlag._M_dataplus._M_p = (pointer)cm.CurrentSnapshot.Position.Position;
  ggi._vptr_cmGlobalGenerator = (_func_int **)cm.CurrentSnapshot.State;
  ggi._8_8_ = cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&ggi);
  cmGlobalGenerator::cmGlobalGenerator(&ggi,&cm);
  this_00 = (cmMakefile *)operator_new(0x760);
  currentRegex.startp[2] = (char *)cm.CurrentSnapshot.Position.Position;
  currentRegex.startp[0] = (char *)cm.CurrentSnapshot.State;
  currentRegex.startp[1] = (char *)cm.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(this_00,&ggi,(cmStateSnapshot *)&currentRegex);
  mf.x_ = this_00;
  pcVar3 = cmGlobalGenerator::CreateLocalGenerator(&ggi,this_00);
  bVar2 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar2) goto LAB_00474f08;
  }
  bVar2 = cmMakefile::ReadListFile(mf.x_,settingsFileName);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar4 = std::operator<<(poVar4,settingsFileName);
    std::endl<char,std::char_traits<char>>(poVar4);
    aVar1 = mf;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_TYPE",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)this);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_NAME",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphName);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_GRAPH_HEADER",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphHeader);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_NODE_PREFIX",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->GraphNodePrefix);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_EXECUTABLES",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_EXECUTABLES",(allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateForExecutables = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_STATIC_LIBS",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_STATIC_LIBS",(allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateForStaticLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_SHARED_LIBS",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_SHARED_LIBS",(allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateForSharedLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_MODULE_LIBS",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_MODULE_LIBS",(allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateForModuleLibs = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)&ignoreTargetsRegexes
                );
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateForExternals = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_PER_TARGET",
               (allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GeneratePerTarget = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_GENERATE_DEPENDERS",
               (allocator *)&ignoreTargetsRegexes);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    aVar1 = mf;
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&currentRegex,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator *)&ignoreTargetsRegexes);
      bVar2 = cmMakefile::IsOn(aVar1.x_,(string *)&currentRegex);
      this->GenerateDependers = bVar2;
      std::__cxx11::string::~string((string *)&currentRegex);
    }
    aVar1.x_ = mf.x_;
    ignoreTargetsRegexes._M_dataplus._M_p = (pointer)&ignoreTargetsRegexes.field_2;
    ignoreTargetsRegexes._M_string_length = 0;
    ignoreTargetsRegexes.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string
              ((string *)&currentRegex,"GRAPHVIZ_IGNORE_TARGETS",(allocator *)&currentRegexString);
    pcVar5 = cmMakefile::GetDefinition(aVar1.x_,(string *)&currentRegex);
    std::__cxx11::string::~string((string *)&currentRegex);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&ignoreTargetsRegexes);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if (ignoreTargetsRegexes._M_string_length != 0) {
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ignoreTargetsRegExVector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&ignoreTargetsRegexes,&ignoreTargetsRegExVector,false);
      for (pbVar6 = ignoreTargetsRegExVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 != ignoreTargetsRegExVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
        std::__cxx11::string::string((string *)&currentRegexString,(string *)pbVar6);
        currentRegex.program = (char *)0x0;
        bVar2 = cmsys::RegularExpression::compile(&currentRegex,currentRegexString._M_dataplus._M_p)
        ;
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar4 = std::operator<<(poVar4,(string *)&currentRegexString);
          poVar4 = std::operator<<(poVar4,"\"");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,&currentRegex);
        cmsys::RegularExpression::~RegularExpression(&currentRegex);
        std::__cxx11::string::~string((string *)&currentRegexString);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ignoreTargetsRegExVector);
    }
    std::__cxx11::string::~string((string *)&ignoreTargetsRegexes);
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_00474f08:
  if (pcVar3 != (cmLocalGenerator *)0x0) {
    (*pcVar3->_vptr_cmLocalGenerator[1])();
  }
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&ggi);
  cmake::~cmake(&cm);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  CM_AUTO_PTR<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if (!cmSystemTools::FileExists(inFileName)) {
    inFileName = fallbackSettingsFileName;
    if (!cmSystemTools::FileExists(inFileName)) {
      return;
    }
  }

  if (!mf->ReadListFile(inFileName)) {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
  }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition)                                    \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = value;                                                          \
    }                                                                         \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition)                               \
  {                                                                           \
    const char* value = mf->GetDefinition(cmakeDefinition);                   \
    if (value) {                                                              \
      (var) = mf->IsOn(cmakeDefinition);                                      \
    }                                                                         \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty()) {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for (std::vector<std::string>::const_iterator itvIt =
           ignoreTargetsRegExVector.begin();
         itvIt != ignoreTargetsRegExVector.end(); ++itvIt) {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str())) {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
      }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
    }
  }
}